

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReportErrorIfHasNoExtraArraynessForOtherEntry
          (InterfaceVariableScalarReplacement *this,Instruction *var)

{
  iterator iVar1;
  Instruction *var_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string message;
  
  var_local = var;
  iVar1 = std::
          _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->vars_without_extra_arrayness)._M_h,&var_local);
  if (iVar1.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur !=
      (__node_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,
               "A variable is not arrayed for an entry point but it is arrayed for another entry point"
               ,(allocator<char> *)&local_88);
    Instruction::PrettyPrint_abi_cxx11_(&local_68,var_local,0x40);
    std::operator+(&local_88,"\n  ",&local_68);
    std::__cxx11::string::append((string *)&message);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&((this->super_Pass).context_)->consumer_,SPV_MSG_ERROR,"",
               (spv_position_t *)&local_88,message._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
  }
  return iVar1.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur !=
         (__node_type *)0x0;
}

Assistant:

bool InterfaceVariableScalarReplacement::
    ReportErrorIfHasNoExtraArraynessForOtherEntry(Instruction* var) {
  if (vars_without_extra_arrayness.find(var) ==
      vars_without_extra_arrayness.end())
    return false;

  std::string message(
      "A variable is not arrayed for an entry point but it is "
      "arrayed for another entry point");
  message +=
      "\n  " + var->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
  context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
  return true;
}